

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O1

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,CoreType ctype,int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 local_20 [16];
  
  local_20[0] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_20;
  BrokerApp(this,ctype,(string_view)(auVar1 << 0x40),argc,argv);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, int argc, char* argv[]):
    BrokerApp(ctype, std::string{}, argc, argv)
{
}